

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzcompelpostproc.h
# Opt level: O3

bool __thiscall
TPZCompElPostProc<TPZCompElH1<pzshape::TPZShapeTriang>_>::dataequal
          (TPZCompElPostProc<TPZCompElH1<pzshape::TPZShapeTriang>_> *this,TPZMaterialData *d1,
          TPZMaterialData *d2)

{
  size_t lineN;
  ulong uVar1;
  uint uVar2;
  double dVar3;
  double dVar4;
  
  lineN = 0x1be;
  if (((d1->p == d2->p) &&
      (lineN = 0x1c7,
      (d1->phi).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow ==
      (d2->phi).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow)) &&
     (uVar2 = (uint)(d1->x).super_TPZVec<double>.fNElements,
     (long)(int)uVar2 == (d2->x).super_TPZVec<double>.fNElements)) {
    if (0 < (int)uVar2) {
      dVar3 = 0.0;
      uVar1 = 0;
      do {
        dVar4 = (d1->x).super_TPZVec<double>.fStore[uVar1] -
                (d2->x).super_TPZVec<double>.fStore[uVar1];
        dVar3 = dVar3 + dVar4 * dVar4;
        uVar1 = uVar1 + 1;
      } while ((uVar2 & 0x7fffffff) != uVar1);
      lineN = 0x1ce;
      if (1e-08 < dVar3) goto LAB_012a34f8;
    }
    return true;
  }
LAB_012a34f8:
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Post/pzcompelpostproc.h"
             ,lineN);
}

Assistant:

inline bool TPZCompElPostProc<TCOMPEL>::dataequal(TPZMaterialData &d1,TPZMaterialData &d2)
{
    const REAL SMALLNUMBER = 1.e-8;
    int i;
    if(d1.p!=d2.p)
    {
        DebugStop();
        return 0;
    }
    REAL res = 0;
    int dim = d1.x.NElements();
    int64_t nshape = d1.phi.Rows();
    int64_t nshape2 = d2.phi.Rows();
    if(dim != d2.x.NElements() || nshape!= nshape2)
    {
        DebugStop();
        return 0; // dimensions and number of integration points shall match
    }
    
    for(i = 0; i < dim; i++)res += pow(d1.x[i]-d2.x[i],(REAL)2.0); // integration points must be at the same locations
    if(res > SMALLNUMBER)
    {
        DebugStop();
        return 0;
    }
    return 1;
}